

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  key_equal *eql;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81c;
  undefined1 in_stack_fffffffffffff81d;
  undefined1 in_stack_fffffffffffff81e;
  undefined1 in_stack_fffffffffffff81f;
  undefined1 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff821;
  undefined1 in_stack_fffffffffffff822;
  undefined1 in_stack_fffffffffffff823;
  undefined1 in_stack_fffffffffffff824;
  undefined1 in_stack_fffffffffffff825;
  undefined1 in_stack_fffffffffffff826;
  undefined1 in_stack_fffffffffffff827;
  undefined4 in_stack_fffffffffffff830;
  uint i_00;
  int line;
  Hasher *this_00;
  Hasher *this_01;
  Type type;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  *this_02;
  string local_7a8 [12];
  int in_stack_fffffffffffff864;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff868;
  char *in_stack_fffffffffffff880;
  undefined7 in_stack_fffffffffffff888;
  undefined1 in_stack_fffffffffffff88f;
  char *in_stack_fffffffffffff890;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffff898;
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8a0;
  string local_738 [36];
  int local_714;
  string local_6e8 [36];
  int local_6c4;
  string local_6c0 [55];
  undefined1 local_689;
  AssertionResult local_688 [3];
  string local_650 [32];
  string local_630 [55];
  byte local_5f9;
  AssertionResult local_5f8;
  string local_5e8 [55];
  undefined1 local_5b1;
  AssertionResult local_5b0 [3];
  string local_578 [32];
  string local_558 [55];
  byte local_521;
  AssertionResult local_520;
  string local_510 [55];
  undefined1 local_4d9;
  AssertionResult local_4d8 [12];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_410;
  Hasher local_3fc;
  string local_3f0 [55];
  undefined1 local_3b9;
  AssertionResult local_3b8;
  string local_3a8 [55];
  byte local_371;
  AssertionResult local_370;
  string local_360 [55];
  undefined1 local_329;
  AssertionResult local_328;
  string local_318 [32];
  string local_2f8 [55];
  byte local_2c1;
  AssertionResult local_2c0;
  string local_2b0 [55];
  undefined1 local_279;
  AssertionResult local_278;
  string local_268 [55];
  byte local_231;
  AssertionResult local_230;
  string local_220 [55];
  undefined1 local_1e9;
  AssertionResult local_1e8;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_1d8;
  Hasher local_1c8;
  Hasher local_1bc [17];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_e8;
  Hasher local_d8;
  Hasher local_cc [17];
  
  this_00 = local_cc;
  i_00 = 0;
  Hasher::Hasher(this_00,0);
  this_01 = &local_d8;
  Hasher::Hasher(this_01,i_00);
  eql = (key_equal *)(ulong)i_00;
  this_02 = &local_e8;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(this_02,i_00,(int *)eql);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)this_02,(size_type)this_01,this_00,eql,
             (allocator_type *)CONCAT44(i_00,in_stack_fffffffffffff830));
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_e8);
  Hasher::Hasher(local_1bc,0);
  Hasher::Hasher(&local_1c8,0);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_1d8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)this_02,(size_type)this_01,this_00,eql,
             (allocator_type *)CONCAT44(i_00,in_stack_fffffffffffff830));
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_1d8);
  uVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff827,
                                   CONCAT16(in_stack_fffffffffffff826,
                                            CONCAT15(in_stack_fffffffffffff825,
                                                     CONCAT14(in_stack_fffffffffffff824,
                                                              CONCAT13(in_stack_fffffffffffff823,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff822,
                                                  CONCAT11(in_stack_fffffffffffff821,
                                                           in_stack_fffffffffffff820))))))),
                       (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff81f,
                                   CONCAT16(in_stack_fffffffffffff81e,
                                            CONCAT15(in_stack_fffffffffffff81d,
                                                     CONCAT14(in_stack_fffffffffffff81c,
                                                              in_stack_fffffffffffff818)))));
  local_1e9 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff826,
                                     CONCAT15(in_stack_fffffffffffff825,
                                              CONCAT14(in_stack_fffffffffffff824,
                                                       CONCAT13(in_stack_fffffffffffff823,
                                                                CONCAT12(in_stack_fffffffffffff822,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff821,
                                                  in_stack_fffffffffffff820))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,
                                       CONCAT15(in_stack_fffffffffffff81d,
                                                CONCAT14(in_stack_fffffffffffff81c,
                                                         in_stack_fffffffffffff818)))),
             (type *)0xef5880);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff826,
                                       CONCAT15(in_stack_fffffffffffff825,
                                                CONCAT14(in_stack_fffffffffffff824,
                                                         CONCAT13(in_stack_fffffffffffff823,
                                                                  CONCAT12(in_stack_fffffffffffff822
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff821,
                                                  in_stack_fffffffffffff820))))))));
    std::__cxx11::string::~string(local_220);
    testing::Message::~Message((Message *)0xef59c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef5a58);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff826,
                                                  CONCAT15(in_stack_fffffffffffff825,
                                                           CONCAT14(in_stack_fffffffffffff824,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
                       ,(BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff81f,
                                    CONCAT16(in_stack_fffffffffffff81e,
                                             CONCAT15(in_stack_fffffffffffff81d,
                                                      CONCAT14(in_stack_fffffffffffff81c,
                                                               in_stack_fffffffffffff818)))));
  local_231 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff825,
                                                    CONCAT14(in_stack_fffffffffffff824,
                                                             CONCAT13(in_stack_fffffffffffff823,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff822,
                                                  CONCAT11(in_stack_fffffffffffff821,
                                                           in_stack_fffffffffffff820))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,
                                       CONCAT15(in_stack_fffffffffffff81d,
                                                CONCAT14(in_stack_fffffffffffff81c,
                                                         in_stack_fffffffffffff818)))),
             (type *)0xef5a96);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_230);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff825,
                                                      CONCAT14(in_stack_fffffffffffff824,
                                                               CONCAT13(in_stack_fffffffffffff823,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffff822,
                                                  CONCAT11(in_stack_fffffffffffff821,
                                                           in_stack_fffffffffffff820))))))));
    std::__cxx11::string::~string(local_268);
    testing::Message::~Message((Message *)0xef5b6b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef5bff);
  uVar4 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff825,
                                                                 CONCAT14(in_stack_fffffffffffff824,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
                       ,(BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff81f,
                                    CONCAT16(in_stack_fffffffffffff81e,
                                             CONCAT15(in_stack_fffffffffffff81d,
                                                      CONCAT14(in_stack_fffffffffffff81c,
                                                               in_stack_fffffffffffff818)))));
  local_279 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff824,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
             ,(bool *)CONCAT17(in_stack_fffffffffffff81f,
                               CONCAT16(in_stack_fffffffffffff81e,
                                        CONCAT15(in_stack_fffffffffffff81d,
                                                 CONCAT14(in_stack_fffffffffffff81c,
                                                          in_stack_fffffffffffff818)))),
             (type *)0xef5c40);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff824,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
              );
    std::__cxx11::string::~string(local_2b0);
    testing::Message::~Message((Message *)0xef5d15);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef5da9);
  uVar5 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffff824,
                                                  CONCAT13(in_stack_fffffffffffff823,
                                                           CONCAT12(in_stack_fffffffffffff822,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffff821,
                                                  in_stack_fffffffffffff820))))))),
                       (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff81f,
                                   CONCAT16(in_stack_fffffffffffff81e,
                                            CONCAT15(in_stack_fffffffffffff81d,
                                                     CONCAT14(in_stack_fffffffffffff81c,
                                                              in_stack_fffffffffffff818)))));
  local_2c1 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
             ,(bool *)CONCAT17(in_stack_fffffffffffff81f,
                               CONCAT16(in_stack_fffffffffffff81e,
                                        CONCAT15(in_stack_fffffffffffff81d,
                                                 CONCAT14(in_stack_fffffffffffff81c,
                                                          in_stack_fffffffffffff818)))),
             (type *)0xef5dec);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
              );
    std::__cxx11::string::~string(local_2f8);
    testing::Message::~Message((Message *)0xef5ec1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef5f58);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_fffffffffffff868,in_stack_fffffffffffff864);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
                    ,(key_type *)
                     CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,
                                       CONCAT15(in_stack_fffffffffffff81d,
                                                CONCAT14(in_stack_fffffffffffff81c,
                                                         in_stack_fffffffffffff818)))));
  std::__cxx11::string::~string(local_318);
  uVar6 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffff823,
                                                  CONCAT12(in_stack_fffffffffffff822,
                                                           CONCAT11(in_stack_fffffffffffff821,
                                                                    in_stack_fffffffffffff820)))))))
                       ,(BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff81f,
                                    CONCAT16(in_stack_fffffffffffff81e,
                                             CONCAT15(in_stack_fffffffffffff81d,
                                                      CONCAT14(in_stack_fffffffffffff81c,
                                                               in_stack_fffffffffffff818)))));
  local_329 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_fffffffffffff822,
                                                  CONCAT11(in_stack_fffffffffffff821,
                                                           in_stack_fffffffffffff820))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,
                                       CONCAT15(in_stack_fffffffffffff81d,
                                                CONCAT14(in_stack_fffffffffffff81c,
                                                         in_stack_fffffffffffff818)))),
             (type *)0xef5fd6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_328);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_fffffffffffff822,
                                                  CONCAT11(in_stack_fffffffffffff821,
                                                           in_stack_fffffffffffff820))))))));
    std::__cxx11::string::~string(local_360);
    testing::Message::~Message((Message *)0xef60d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef6165);
  uVar7 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6
                                                  ,CONCAT12(in_stack_fffffffffffff822,
                                                            CONCAT11(in_stack_fffffffffffff821,
                                                                     in_stack_fffffffffffff820))))))
                                  ),
                       (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff81f,
                                   CONCAT16(in_stack_fffffffffffff81e,
                                            CONCAT15(in_stack_fffffffffffff81d,
                                                     CONCAT14(in_stack_fffffffffffff81c,
                                                              in_stack_fffffffffffff818)))));
  local_371 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffff821,
                                                                 in_stack_fffffffffffff820))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,
                                       CONCAT15(in_stack_fffffffffffff81d,
                                                CONCAT14(in_stack_fffffffffffff81c,
                                                         in_stack_fffffffffffff818)))),
             (type *)0xef61a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_370);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffff821,
                                                                 in_stack_fffffffffffff820))))))));
    std::__cxx11::string::~string(local_3a8);
    testing::Message::~Message((Message *)0xef627d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef6311);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(in_stack_fffffffffffff821,
                                                                 in_stack_fffffffffffff820))))))),
           CONCAT17(in_stack_fffffffffffff81f,
                    CONCAT16(in_stack_fffffffffffff81e,
                             CONCAT15(in_stack_fffffffffffff81d,
                                      CONCAT14(in_stack_fffffffffffff81c,in_stack_fffffffffffff818))
                            )));
  uVar8 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6
                                                  ,CONCAT12(uVar7,CONCAT11(in_stack_fffffffffffff821
                                                                           ,
                                                  in_stack_fffffffffffff820))))))),
                       (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff81f,
                                   CONCAT16(in_stack_fffffffffffff81e,
                                            CONCAT15(in_stack_fffffffffffff81d,
                                                     CONCAT14(in_stack_fffffffffffff81c,
                                                              in_stack_fffffffffffff818)))));
  local_3b9 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,in_stack_fffffffffffff820))))
                                                  ))),
             (bool *)CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,
                                       CONCAT15(in_stack_fffffffffffff81d,
                                                CONCAT14(in_stack_fffffffffffff81c,
                                                         in_stack_fffffffffffff818)))),
             (type *)0xef6366);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,in_stack_fffffffffffff820))))
                                                  ))));
    std::__cxx11::string::~string(local_3f0);
    testing::Message::~Message((Message *)0xef643b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef64d2);
  Hasher::Hasher(&local_3fc,1);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_410,2,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)this_02,(size_type)this_01,this_00,eql,
             (allocator_type *)CONCAT44(i_00,in_stack_fffffffffffff830));
  uVar9 = google::
          BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6
                                                  ,CONCAT12(uVar7,CONCAT11(uVar8,
                                                  in_stack_fffffffffffff820))))))),
                       (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff81f,
                                   CONCAT16(in_stack_fffffffffffff81e,
                                            CONCAT15(in_stack_fffffffffffff81d,
                                                     CONCAT14(in_stack_fffffffffffff81c,
                                                              in_stack_fffffffffffff818)))));
  local_4d9 = uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff81f,
                              CONCAT16(in_stack_fffffffffffff81e,
                                       CONCAT15(in_stack_fffffffffffff81d,
                                                CONCAT14(in_stack_fffffffffffff81c,
                                                         in_stack_fffffffffffff818)))),
             (type *)0xef6566);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_510);
    testing::Message::~Message((Message *)0xef666d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef6701);
  uVar10 = google::
           BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff81f,
                                    CONCAT16(in_stack_fffffffffffff81e,
                                             CONCAT15(in_stack_fffffffffffff81d,
                                                      CONCAT14(in_stack_fffffffffffff81c,
                                                               in_stack_fffffffffffff818)))));
  local_521 = ~uVar10 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffff81e,
                                              CONCAT15(in_stack_fffffffffffff81d,
                                                       CONCAT14(in_stack_fffffffffffff81c,
                                                                in_stack_fffffffffffff818)))),
             (type *)0xef6744);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_558);
    testing::Message::~Message((Message *)0xef6819);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef68b0);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898._M_head_impl);
  std::__cxx11::string::~string(local_578);
  uVar11 = google::
           BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffff81e,
                                                    CONCAT15(in_stack_fffffffffffff81d,
                                                             CONCAT14(in_stack_fffffffffffff81c,
                                                                      in_stack_fffffffffffff818)))))
  ;
  local_5b1 = uVar11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffff81d,
                                                              CONCAT14(in_stack_fffffffffffff81c,
                                                                       in_stack_fffffffffffff818))))
             ,(type *)0xef6936);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_5b0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_5e8);
    testing::Message::~Message((Message *)0xef6a31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef6ac5);
  uVar12 = google::
           BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffff81d,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffff81c,
                                                  in_stack_fffffffffffff818)))));
  local_5f9 = ~uVar12 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(
                                                  in_stack_fffffffffffff81c,
                                                  in_stack_fffffffffffff818)))),(type *)0xef6b08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5f8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_630);
    testing::Message::~Message((Message *)0xef6bdd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef6c74);
  HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898._M_head_impl);
  std::__cxx11::string::~string(local_650);
  uVar13 = google::
           BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(
                                                  in_stack_fffffffffffff81c,
                                                  in_stack_fffffffffffff818)))));
  local_689 = uVar13;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(uVar13,
                                                  in_stack_fffffffffffff818)))),(type *)0xef6cfa);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_688);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888),
               in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)this_01 >> 0x20),(char *)this_00,
               (int)((ulong)eql >> 0x20),(char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_6c0);
    testing::Message::~Message((Message *)0xef6df5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef6e8c);
  for (local_6c4 = 3; local_6c4 < 0x7d1; local_6c4 = local_6c4 + 1) {
    HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
    google::
    BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898._M_head_impl);
    std::__cxx11::string::~string(local_6e8);
  }
  local_714 = 2000;
  while( true ) {
    type = (Type)((ulong)this_01 >> 0x20);
    line = (int)((ulong)eql >> 0x20);
    if (local_714 < 3) break;
    HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
    google::
    BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898._M_head_impl);
    std::__cxx11::string::~string(local_738);
    local_714 = local_714 + -1;
  }
  uVar14 = google::
           BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(
                                                  uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))))))),
                        (BaseHashtableInterface<google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(uVar13,
                                                  in_stack_fffffffffffff818)))));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),
             (bool *)CONCAT17(uVar10,CONCAT16(uVar11,CONCAT15(uVar12,CONCAT14(uVar13,CONCAT13(uVar14
                                                  ,(int3)in_stack_fffffffffffff818))))),
             (type *)0xef700b);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffff890);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff898._M_head_impl,in_stack_fffffffffffff890,
               (char *)CONCAT17(uVar14,in_stack_fffffffffffff888),in_stack_fffffffffffff880);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)this_00,line,
               (char *)CONCAT44(i_00,in_stack_fffffffffffff830));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff8a0,
               (Message *)in_stack_fffffffffffff898._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
    std::__cxx11::string::~string(local_7a8);
    testing::Message::~Message((Message *)0xef70ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xef7132);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xef713f);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_410);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xef7159);
  google::
  HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xef7166);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}